

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

void __thiscall OpenMD::FragmentStamp::checkCutoffGroups(FragmentStamp *this)

{
  iterator __position;
  int *piVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer ppCVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  pointer piVar6;
  ostream *poVar7;
  OpenMDException *this_00;
  pointer ppAVar8;
  _Iter_equals_val<const_int> __pred;
  ulong uVar9;
  vector<int,_std::allocator<int>_> cutoffGroupAtoms;
  ostringstream oss;
  vector<int,_std::allocator<int>_> local_1e0;
  string local_1c8;
  int local_1a8 [2];
  long local_1a0;
  
  ppAVar8 = (this->atomStamps_).
            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppAVar8 !=
      (this->atomStamps_).
      super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_1a8[0] = (*ppAVar8)->index_;
      __position._M_current =
           (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->freeAtoms_,__position,local_1a8);
      }
      else {
        *__position._M_current = local_1a8[0];
        (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      ppAVar8 = ppAVar8 + 1;
    } while (ppAVar8 !=
             (this->atomStamps_).
             super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppCVar4 = (this->cutoffGroupStamps_).
            super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->cutoffGroupStamps_).
      super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar4) {
    uVar9 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_1e0,&ppCVar4[(int)uVar9]->members_);
      local_1a0 = ((long)(this->atomStamps_).
                         super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->atomStamps_).
                         super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) + -1;
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                        (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,local_1a8);
      __pred._M_value =
           local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
      if (_Var5._M_current !=
          local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar3 = (this->Name).data_._M_dataplus._M_p;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,pcVar3,pcVar3 + (this->Name).data_._M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,
                            local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": cutoffGroup",0xd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," is out of range\n",0x11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(this_00,&local_1c8);
        __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      for (; __pred._M_value !=
             local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish; __pred._M_value = __pred._M_value + 1) {
        _Var5 = std::
                __remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,__pred);
        piVar1 = (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((_Var5._M_current != piVar1) &&
           (piVar2 = (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
           piVar6 = (pointer)((long)_Var5._M_current + ((long)piVar2 - (long)piVar1)),
           piVar2 != piVar6)) {
          (this->freeAtoms_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar6;
        }
      }
      if (local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar9 = uVar9 + 1;
      ppCVar4 = (this->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->cutoffGroupStamps_).
                                   super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3))
    ;
  }
  return;
}

Assistant:

void FragmentStamp::checkCutoffGroups() {
    std::vector<AtomStamp*>::iterator ai;
    std::vector<int>::iterator fai;

    // add all atoms into freeAtoms_ set
    for (ai = atomStamps_.begin(); ai != atomStamps_.end(); ++ai) {
      freeAtoms_.push_back((*ai)->getIndex());
    }

    for (std::size_t i = 0; i < getNCutoffGroups(); ++i) {
      CutoffGroupStamp* cutoffGroupStamp = getCutoffGroupStamp(i);
      std::vector<int> cutoffGroupAtoms  = cutoffGroupStamp->getMembers();
      std::vector<int>::iterator j       = std::find_if(
          cutoffGroupAtoms.begin(), cutoffGroupAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      if (j != cutoffGroupAtoms.end()) {
        std::ostringstream oss;
        oss << "Error in Fragment " << getName() << ": cutoffGroup"
            << " is out of range\n";
        throw OpenMDException(oss.str());
      }

      for (fai = cutoffGroupAtoms.begin(); fai != cutoffGroupAtoms.end();
           ++fai) {
        // erase the atoms belonging to cutoff groups from freeAtoms_ vector
        freeAtoms_.erase(
            std::remove(freeAtoms_.begin(), freeAtoms_.end(), (*fai)),
            freeAtoms_.end());
      }
    }
  }